

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Embed.cpp
# Opt level: O2

void CoreMLConverter::convertCaffeEmbed(ConvertLayerParameters layerParameters)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Rep *pRVar4;
  string *psVar5;
  EmbeddingLayerParams *this;
  int iVar6;
  Type *pTVar7;
  EmbedParameter *pEVar8;
  Type *pTVar9;
  BlobShape *pBVar10;
  ulong uVar11;
  int64 iVar12;
  uint64 uVar13;
  WeightParams *pWVar14;
  int iVar15;
  void **ppvVar16;
  uint __val;
  char *__assertion;
  uint uVar17;
  long lVar18;
  long lVar19;
  allocator local_17a;
  char local_179;
  Type *local_178;
  float local_170 [8];
  string local_150;
  uint64 local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  Type *local_e8;
  NeuralNetworkLayer *local_e0;
  string local_d8;
  string local_b8;
  string local_98;
  uint local_78;
  uint local_74;
  EmbeddingLayerParams *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     (&((layerParameters.prototxt)->layer_).super_RepeatedPtrFieldBase,
                      *layerParameters.layerId);
  iVar6 = getLayerIndex(pTVar7,layerParameters.mapCaffeLayerNamesToIndex);
  local_178 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                        (&((layerParameters.protoweights)->layer_).super_RepeatedPtrFieldBase,iVar6)
  ;
  local_e0 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                       (layerParameters.nnWrite);
  if (((pTVar7->bottom_).super_RepeatedPtrFieldBase.current_size_ == 1) &&
     ((pTVar7->top_).super_RepeatedPtrFieldBase.current_size_ == 1)) {
    lVar19 = 1;
  }
  else {
    std::__cxx11::string::string
              ((string *)local_170,"Must have 1 input and 1 output",(allocator *)&local_150);
    errorInCaffeProto((string *)local_170,(pTVar7->name_).ptr_,(pTVar7->type_).ptr_);
    std::__cxx11::string::~string((string *)local_170);
    lVar19 = (long)(pTVar7->bottom_).super_RepeatedPtrFieldBase.current_size_;
  }
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar4 = (pTVar7->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar16 = pRVar4->elements;
  if (pRVar4 == (Rep *)0x0) {
    ppvVar16 = (void **)0x0;
  }
  local_e8 = pTVar7;
  for (lVar18 = 0; lVar19 * 8 != lVar18; lVar18 = lVar18 + 8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&bottom,*(value_type **)((long)ppvVar16 + lVar18));
  }
  pRVar4 = (local_e8->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar16 = pRVar4->elements;
  if (pRVar4 == (Rep *)0x0) {
    ppvVar16 = (void **)0x0;
  }
  iVar6 = (local_e8->top_).super_RepeatedPtrFieldBase.current_size_;
  for (lVar19 = 0; pTVar7 = local_e8, (long)iVar6 * 8 != lVar19; lVar19 = lVar19 + 8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&top,*(value_type **)((long)ppvVar16 + lVar19));
  }
  convertCaffeMetadata
            ((local_e8->name_).ptr_,&bottom,&top,layerParameters.nnWrite,
             layerParameters.mappingDataBlobNames);
  pEVar8 = pTVar7->embed_param_;
  if (pEVar8 == (EmbedParameter *)0x0) {
    pEVar8 = (EmbedParameter *)&caffe::_EmbedParameter_default_instance_;
  }
  uVar2 = pEVar8->num_output_;
  local_130 = (uint64)pEVar8->input_dim_;
  bVar1 = pEVar8->bias_term_;
  iVar6 = (local_178->blobs_).super_RepeatedPtrFieldBase.current_size_;
  uVar17 = 0;
  if (1 < iVar6) {
    pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                       (&(local_178->blobs_).super_RepeatedPtrFieldBase,1);
    uVar17 = (pTVar9->data_).current_size_;
    iVar6 = (local_178->blobs_).super_RepeatedPtrFieldBase.current_size_;
  }
  if (iVar6 == 0) {
    std::__cxx11::string::string
              ((string *)local_170,"Weight blobs not provided",(allocator *)&local_108);
    psVar5 = (pTVar7->name_).ptr_;
    std::__cxx11::string::string((string *)&local_150,"Embed",(allocator *)&local_128);
    errorInCaffeProto((string *)local_170,psVar5,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)local_170);
  }
  if ((uVar17 == 0) && (bVar1 != false)) {
    std::__cxx11::string::string
              ((string *)local_170,
               "Expected bias parameters when \'bias_term\' flag is set to True.",
               (allocator *)&local_108);
    psVar5 = (pTVar7->name_).ptr_;
    std::__cxx11::string::string((string *)&local_150,"Embed",(allocator *)&local_128);
    errorInCaffeProto((string *)local_170,psVar5,&local_150);
LAB_004723b2:
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)local_170);
  }
  else if ((0 < (int)uVar17) && (bVar1 == false)) {
    std::__cxx11::string::string
              ((string *)local_170,"Found bias parameters even though \'bias_term\' flag is False",
               (allocator *)&local_108);
    psVar5 = (pTVar7->name_).ptr_;
    std::__cxx11::string::string((string *)&local_150,"Embed",(allocator *)&local_128);
    errorInCaffeProto((string *)local_170,psVar5,&local_150);
    goto LAB_004723b2;
  }
  local_178 = (Type *)&local_178->blobs_;
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                     ((RepeatedPtrFieldBase *)local_178,0);
  pBVar10 = pTVar9->shape_;
  if (pBVar10 == (BlobShape *)0x0) {
    pBVar10 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  if ((pBVar10->dim_).current_size_ != 2) {
    std::__cxx11::string::string
              ((string *)local_170,"Weight blob dim size is not 2",(allocator *)&local_108);
    psVar5 = (pTVar7->name_).ptr_;
    std::__cxx11::string::string((string *)&local_150,"Embed",(allocator *)&local_128);
    errorInCaffeProto((string *)local_170,psVar5,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)local_170);
  }
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                     ((RepeatedPtrFieldBase *)local_178,0);
  pBVar10 = pTVar9->shape_;
  if (pBVar10 == (BlobShape *)0x0) {
    pBVar10 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  uVar11 = caffe::BlobShape::dim(pBVar10,1);
  if (uVar11 != uVar2) {
    std::__cxx11::to_string(&local_98,uVar2);
    std::operator+(&local_128,"num_output(",&local_98);
    std::operator+(&local_108,&local_128,
                   ") does not match the second dimension of the weight matrix(");
    pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                       ((RepeatedPtrFieldBase *)local_178,0);
    pBVar10 = pTVar9->shape_;
    if (pBVar10 == (BlobShape *)0x0) {
      pBVar10 = (BlobShape *)&caffe::_BlobShape_default_instance_;
    }
    iVar12 = caffe::BlobShape::dim(pBVar10,1);
    std::__cxx11::to_string(&local_b8,iVar12);
    std::operator+(&local_150,&local_108,&local_b8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                   &local_150,")");
    psVar5 = (pTVar7->name_).ptr_;
    std::__cxx11::string::string((string *)&local_d8,"Embed",&local_17a);
    errorInCaffeProto((string *)local_170,psVar5,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_98);
  }
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                     ((RepeatedPtrFieldBase *)local_178,0);
  pBVar10 = pTVar9->shape_;
  if (pBVar10 == (BlobShape *)0x0) {
    pBVar10 = (BlobShape *)&caffe::_BlobShape_default_instance_;
  }
  uVar13 = caffe::BlobShape::dim(pBVar10,0);
  if (uVar13 != local_130) {
    std::__cxx11::to_string(&local_98,(uint)local_130);
    std::operator+(&local_128,"input_dim(",&local_98);
    std::operator+(&local_108,&local_128,
                   ") does not match the first dimension of the weight matrix(");
    pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                       ((RepeatedPtrFieldBase *)local_178,0);
    pBVar10 = pTVar9->shape_;
    if (pBVar10 == (BlobShape *)0x0) {
      pBVar10 = (BlobShape *)&caffe::_BlobShape_default_instance_;
    }
    iVar12 = caffe::BlobShape::dim(pBVar10,0);
    std::__cxx11::to_string(&local_b8,iVar12);
    std::operator+(&local_150,&local_108,&local_b8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                   &local_150,")");
    psVar5 = (pTVar7->name_).ptr_;
    std::__cxx11::string::string((string *)&local_d8,"Embed",&local_17a);
    errorInCaffeProto((string *)local_170,psVar5,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_98);
  }
  local_70 = CoreML::Specification::NeuralNetworkLayer::mutable_embedding(local_e0);
  uVar13 = local_130;
  local_70->inputdim_ = local_130;
  local_70->outputchannels_ = (ulong)uVar2;
  local_70->hasbias_ = bVar1;
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                     ((RepeatedPtrFieldBase *)local_178,0);
  __val = uVar2 * (int)uVar13;
  uVar3 = (pTVar9->data_).current_size_;
  if (((int)uVar3 < 0) || (uVar3 != __val)) {
    std::__cxx11::to_string(&local_98,__val);
    std::operator+(&local_128,"Expected blob size = ",&local_98);
    std::operator+(&local_108,&local_128," but found blob of size = ");
    std::__cxx11::to_string(&local_b8,uVar3);
    std::operator+(&local_150,&local_108,&local_b8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                   &local_150," in caffe");
    psVar5 = (pTVar7->name_).ptr_;
    std::__cxx11::string::string((string *)&local_d8,"Inner Product",&local_17a);
    errorInCaffeProto((string *)local_170,psVar5,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_98);
  }
  pWVar14 = CoreML::Specification::EmbeddingLayerParams::mutable_weights(local_70);
  uVar13 = local_130;
  if (-1 < (int)__val) {
    local_170[0] = 0.0;
    local_179 = bVar1;
    local_78 = uVar17;
    google::protobuf::RepeatedField<float>::Resize(&pWVar14->floatvalue_,__val,local_170);
    iVar6 = 0;
    uVar17 = 0;
    while( true ) {
      this = local_70;
      uVar3 = local_78;
      local_e0 = (NeuralNetworkLayer *)CONCAT44(local_e0._4_4_,iVar6);
      local_74 = uVar17;
      if (uVar17 == uVar2) break;
      while (iVar15 = (int)uVar13, uVar13 = (uint64)(iVar15 - 1), iVar15 != 0) {
        if (iVar6 < 0) {
          __assertion = "index <= INT_MAX";
          uVar2 = 0x62;
          goto LAB_00472af6;
        }
        if ((int)uVar17 < 0) {
          __assertion = "dataIndex <= INT_MAX";
          uVar2 = 100;
          goto LAB_00472af6;
        }
        pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                           ((RepeatedPtrFieldBase *)local_178,0);
        local_170[0] = caffe::BlobProto::data(pTVar9,uVar17);
        google::protobuf::RepeatedField<float>::Set(&pWVar14->floatvalue_,iVar6,local_170);
        iVar6 = iVar6 + 1;
        uVar17 = uVar17 + uVar2;
      }
      uVar17 = local_74 + 1;
      iVar6 = (int)local_e0 + (int)local_130;
      uVar13 = local_130;
    }
    if (local_179 != '\0') {
      if (((int)local_78 < 0) || (local_78 != uVar2)) {
        std::__cxx11::to_string(&local_98,uVar2);
        std::operator+(&local_128,"Expected blob size = ",&local_98);
        pTVar7 = local_e8;
        std::operator+(&local_108,&local_128," but found blob of size = ");
        std::__cxx11::to_string(&local_b8,uVar3);
        std::operator+(&local_150,&local_108,&local_b8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_170,&local_150," in caffe");
        psVar5 = (pTVar7->name_).ptr_;
        std::__cxx11::string::string((string *)&local_d8,"Inner Product",&local_17a);
        errorInCaffeProto((string *)local_170,psVar5,&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)local_170);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_98);
      }
      pWVar14 = CoreML::Specification::EmbeddingLayerParams::mutable_bias(this);
      if ((int)uVar2 < 0) {
        __assertion = "outputChannels <= INT_MAX";
        uVar2 = 0x71;
        goto LAB_00472af6;
      }
      local_170[0] = 0.0;
      google::protobuf::RepeatedField<float>::Resize(&pWVar14->floatvalue_,uVar2,local_170);
      pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                         ((RepeatedPtrFieldBase *)local_178,1);
      google::protobuf::RepeatedField<float>::CopyFrom(&pWVar14->floatvalue_,&pTVar9->data_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&top);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&bottom);
    return;
  }
  __assertion = "blobSize <= INT_MAX";
  uVar2 = 0x5d;
LAB_00472af6:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Embed.cpp"
                ,uVar2,
                "void CoreMLConverter::convertCaffeEmbed(CoreMLConverter::ConvertLayerParameters)");
}

Assistant:

void CoreMLConverter::convertCaffeEmbed(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
   
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(),
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    const caffe::EmbedParameter& caffeLayerParams = caffeLayer.embed_param();
    
    uint32_t inputChannels = caffeLayerParams.input_dim();
    uint32_t outputChannels = caffeLayerParams.num_output();
    bool hasBias = caffeLayerParams.bias_term();
    int caffeBiasLength = 0;
    if (caffeLayerWeights.blobs_size()>1){
        caffeBiasLength = caffeLayerWeights.blobs(1).data_size();
    }
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerWeights.blobs_size() == 0){
        CoreMLConverter::errorInCaffeProto("Weight blobs not provided", caffeLayer.name(), "Embed");
    }
    if (hasBias && caffeBiasLength == 0){
        CoreMLConverter::errorInCaffeProto("Expected bias parameters when 'bias_term' flag is set to True.", caffeLayer.name(), "Embed");
    }
    if (!hasBias && caffeBiasLength > 0) {
        CoreMLConverter::errorInCaffeProto("Found bias parameters even though 'bias_term' flag is False", caffeLayer.name(), "Embed");
    }
    if (caffeLayerWeights.blobs(0).shape().dim_size() != 2){
        CoreMLConverter::errorInCaffeProto("Weight blob dim size is not 2", caffeLayer.name(), "Embed");
    }
    if (caffeLayerWeights.blobs(0).shape().dim(1) != outputChannels){
        CoreMLConverter::errorInCaffeProto("num_output("+std::to_string(outputChannels)+") does not match the second dimension of the weight matrix("+std::to_string(caffeLayerWeights.blobs(0).shape().dim(1))+")"
                                          ,caffeLayer.name(), "Embed");
    }
    if (caffeLayerWeights.blobs(0).shape().dim(0) != inputChannels){
        CoreMLConverter::errorInCaffeProto("input_dim("+std::to_string(inputChannels)+") does not match the first dimension of the weight matrix("+std::to_string(caffeLayerWeights.blobs(0).shape().dim(0))+")"
                                          ,caffeLayer.name(), "Embed");
    }
    //**************************************************************
    
    Specification::EmbeddingLayerParams* specLayerParams = specLayer->mutable_embedding();
    specLayerParams->set_inputdim(inputChannels);
    specLayerParams->set_outputchannels(outputChannels);
    specLayerParams->set_hasbias(hasBias);
    
    // Write weights: need to transpose
    // Caffe embed weights are stored as [inputChannels,outputChannels]
    // CoreML needs in the format: [outputChannels,inputChannels]
    uint32_t blobSize = inputChannels*outputChannels;
    int caffeBlobSizeWeights = caffeLayerWeights.blobs(0).data_size();
    if (caffeBlobSizeWeights < 0 ||
        static_cast<uint32_t>(caffeBlobSizeWeights) != blobSize) {
        CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(blobSize)+" but found blob of size = "+std::to_string(caffeBlobSizeWeights)+" in caffe"
                                          , caffeLayer.name(), "Inner Product");
    }
    ::google::protobuf::RepeatedField<float>* weightsWrite = specLayerParams->mutable_weights()->mutable_floatvalue();
    assert(blobSize <= INT_MAX);
    weightsWrite->Resize(static_cast<int>(blobSize), 0.0);
    for (uint32_t r=0; r<outputChannels; r++){
        for (uint32_t c=0; c<inputChannels; c++){
            uint32_t index = r*inputChannels+c;
            assert(index <= INT_MAX);
            uint32_t dataIndex = c*outputChannels+r;
            assert(dataIndex <= INT_MAX);
            weightsWrite->Set(static_cast<int>(index), caffeLayerWeights.blobs(0).data(static_cast<int>(dataIndex)));
        }
    }
    
    // Write bias
    if (hasBias) {
        if (caffeBiasLength < 0 ||
            static_cast<uint32_t>(caffeBiasLength) != outputChannels) {
            CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(outputChannels)+" but found blob of size = "+std::to_string(caffeBiasLength)+" in caffe"
                                              , caffeLayer.name(), "Inner Product");
        }
        ::google::protobuf::RepeatedField<float>* biasWrite = specLayerParams->mutable_bias()->mutable_floatvalue();
        assert(outputChannels <= INT_MAX);
        biasWrite->Resize(static_cast<int>(outputChannels), 0.0);
        biasWrite->CopyFrom(caffeLayerWeights.blobs(1).data());
    }

}